

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasmbox.c
# Opt level: O1

wasm_u16_t setup_params(wasmbox_mutable_function_t *func,wasmbox_type_t *type)

{
  wasm_u16_t wVar1;
  wasm_u16_t wVar2;
  wasm_s16_t wVar3;
  uint uVar4;
  wasmbox_code_t wStack_58;
  
  wVar1 = func->stack_top;
  if (type->argument_size != 0) {
    wVar2 = type->return_size;
    uVar4 = 0;
    do {
      wVar3 = wasmbox_function_pop_stack(func);
      wStack_58.op1.value.u32 = (wasm_u32_t)wVar3;
      wStack_58.op0.index = (ushort)(wVar2 + wVar1 + 2) + uVar4;
      wStack_58.h.opcode = 0xb0;
      wasmbox_code_add(func,&wStack_58);
      uVar4 = uVar4 + 1;
    } while (uVar4 < type->argument_size);
  }
  return wVar1;
}

Assistant:

static wasm_u16_t setup_params(wasmbox_mutable_function_t *func,
                               wasmbox_type_t *type) {
  wasm_u16_t stack_top = func->stack_top;
  wasm_u16_t argument_to =
      stack_top + type->return_size + WASMBOX_FUNCTION_CALL_OFFSET;
  for (int i = 0; i < type->argument_size; ++i) {
    wasmbox_code_add_move(func, wasmbox_function_pop_stack(func),
                          argument_to + i);
  }
  return stack_top;
}